

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_cdataSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  byte *pbVar8;
  long lStack_40;
  
  if (end <= ptr) {
    return -4;
  }
  iVar7 = 0;
  iVar4 = 0;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    goto switchD_004f0d6c_caseD_0;
  default:
    pbVar8 = (byte *)(ptr + 1);
    break;
  case 4:
    pbVar8 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar8 || (long)end - (long)pbVar8 < 0) {
      return -1;
    }
    if (*pbVar8 == 0x5d) {
      pcVar6 = ptr + 2;
      if (end == pcVar6 || (long)end - (long)pcVar6 < 0) {
        return -1;
      }
      if (*pcVar6 == '>') {
        ptr = ptr + 3;
        iVar4 = 0x28;
        goto switchD_004f0d6c_caseD_0;
      }
    }
    break;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar3 = (*enc[3].literalScanners[1])
                      (enc,ptr,end,(char **)&switchD_004f0d6c::switchdataD_005f210c);
    iVar4 = iVar7;
    if (iVar3 != 0) goto switchD_004f0d6c_caseD_0;
    pbVar8 = (byte *)(ptr + 2);
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar3 = (*enc[3].sameName)(enc,ptr,end);
    iVar4 = iVar7;
    if (iVar3 != 0) goto switchD_004f0d6c_caseD_0;
    pbVar8 = (byte *)(ptr + 3);
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,end,(char *)&switchD_004f0d6c::switchdataD_005f210c);
    iVar4 = iVar7;
    if (iVar3 != 0) goto switchD_004f0d6c_caseD_0;
    pbVar8 = (byte *)(ptr + 4);
    break;
  case 9:
    pbVar8 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar8 || (long)end - (long)pbVar8 < 0) {
      return -1;
    }
    pbVar1 = (byte *)(ptr + 1);
    ptr = ptr + 2;
    if (*(char *)((long)enc[1].scanners + (ulong)*pbVar1) != '\n') {
      ptr = (char *)pbVar8;
    }
    goto LAB_004f0e4c;
  case 10:
    ptr = ptr + 1;
LAB_004f0e4c:
    iVar4 = 7;
    goto switchD_004f0d6c_caseD_0;
  }
  for (; uVar5 = (long)end - (long)pbVar8, 0 < (long)uVar5; pbVar8 = pbVar8 + lStack_40) {
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar8);
    lStack_40 = 1;
    if ((ulong)bVar2 < 0xb) {
      pcVar6 = (char *)((long)&switchD_004f0e9a::switchdataD_005f2138 +
                       (long)(int)(&switchD_004f0e9a::switchdataD_005f2138)[bVar2]);
      switch(bVar2) {
      default:
        goto switchD_004f0e9a_caseD_0;
      case 2:
      case 3:
        goto switchD_004f0e9a_caseD_2;
      case 5:
        if (uVar5 == 1) goto switchD_004f0e9a_caseD_0;
        iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar8,pcVar6,(char **)0x1);
        lStack_40 = 2;
        break;
      case 6:
        if (uVar5 < 3) goto switchD_004f0e9a_caseD_0;
        iVar4 = (*enc[3].sameName)(enc,(char *)pbVar8,pcVar6);
        lStack_40 = 3;
        break;
      case 7:
        if (uVar5 < 4) goto switchD_004f0e9a_caseD_0;
        iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar8,pcVar6,(char *)0x1);
        lStack_40 = 4;
      }
      if (iVar4 != 0) break;
    }
switchD_004f0e9a_caseD_2:
  }
switchD_004f0e9a_caseD_0:
  ptr = (char *)pbVar8;
  iVar4 = 6;
switchD_004f0d6c_caseD_0:
  *nextTokPtr = ptr;
  return iVar4;
}

Assistant:

static int PTRCALL
PREFIX(cdataSectionTok)(const ENCODING *enc, const char *ptr,
                        const char *end, const char **nextTokPtr)
{
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_RSQB:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_CDATA_SECT_CLOSE;
  case BT_CR:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
    case BT_RSQB:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}